

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket.cpp
# Opt level: O2

void __thiscall QLocalSocket::setSocketOptions(QLocalSocket *this,SocketOptions option)

{
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  QFlagsStorageHelper<QLocalSocket::SocketOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<QLocalSocket::SocketOption>.i =
       (QFlagsStorage<QLocalSocket::SocketOption>)
       (QFlagsStorage<QLocalSocket::SocketOption>)
       option.super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>.
       super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  if (*(int *)(*(long *)&this->field_0x8 + 0x1c8) == 0) {
    QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
    ::setValue((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
                *)(*(long *)&this->field_0x8 + 0x200),(parameter_type)&local_c);
  }
  else {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning
              (local_30,"QLocalSocket::setSocketOptions() called while not in unconnected state");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocket::setSocketOptions(QLocalSocket::SocketOptions option)
{
    Q_D(QLocalSocket);
    if (d->state != UnconnectedState) {
        qWarning("QLocalSocket::setSocketOptions() called while not in unconnected state");
        return;
    }
    d->socketOptions = option;
}